

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-powerpc.cpp
# Opt level: O2

void __thiscall
powerpc_test_cpu::test_instruction_RRI__(powerpc_test_cpu *this,char *insn,uint32_t opcode)

{
  uint a2;
  uint32_t a1;
  int iVar1;
  long lVar2;
  long lVar3;
  
  if (test_instruction_RRI__(char_const*,unsigned_int)::code == '\0') {
    iVar1 = __cxa_guard_acquire(&test_instruction_RRI__(char_const*,unsigned_int)::code);
    if (iVar1 != 0) {
      test_instruction_RRI__::code[0] = 0;
      test_instruction_RRI__::code[1] = 0x4e800020;
      test_instruction_RRI__::code[2] = 0x7c802378;
      test_instruction_RRI__::code[3] = 0;
      test_instruction_RRI__::code[4] = 0x4e800020;
      __cxa_guard_release(&test_instruction_RRI__(char_const*,unsigned_int)::code);
    }
  }
  for (lVar2 = 0; lVar2 != 0x24; lVar2 = lVar2 + 1) {
    a2 = imm_values[lVar2];
    test_instruction_RRI__::code[0] = a2 & 0xffff | opcode & 0xffff0000;
    test_instruction_RRI__::code[3] = a2 & 0xffff | opcode & 0xffe00000;
    for (lVar3 = 0; lVar3 != 0x90; lVar3 = lVar3 + 4) {
      a1 = *(uint32_t *)((long)reg_values + lVar3);
      test_one(this,test_instruction_RRI__::code,insn,a1,a2,0,0);
      test_one(this,test_instruction_RRI__::code + 2,insn,a1,a2,0,0);
    }
  }
  return;
}

Assistant:

void powerpc_test_cpu::test_instruction_RRI__(const char *insn, uint32_t opcode)
{
	// Test code
	static uint32_t code[] = {
		POWERPC_ILLEGAL, POWERPC_BLR,
		POWERPC_MR(0, RA), POWERPC_ILLEGAL, POWERPC_BLR
	};

	// Input values
	const int n_reg_values = sizeof(reg_values)/sizeof(reg_values[0]);
	const int n_imm_values = sizeof(imm_values)/sizeof(imm_values[0]);

	for (int j = 0; j < n_imm_values; j++) {
		const uint32_t im = imm_values[j];
		uint32_t op = opcode;
		UIMM_field::insert(op, im);
		code[0] = code[3] = op;				// <op> RD,RA,IM
		rA_field::insert(code[3], 0);		// <op> RD,R0,IM
		flush_icache_range(code, sizeof(code));
		for (int i = 0; i < n_reg_values; i++) {
			const uint32_t ra = reg_values[i];
			test_one(&code[0], insn, ra, im, 0);
			test_one(&code[2], insn, ra, im, 0);
		}
	}
}